

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pSrcBuffer,
          Uint64 SrcOffset,RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
          IBuffer *pDstBuffer,Uint64 DstOffset,Uint64 Size,
          RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)

{
  BufferDesc *Args;
  BufferDesc *Args_2;
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  BufferVkImpl *pBVar3;
  BufferVkImpl *pBVar4;
  Uint64 extraout_RDX;
  Uint64 UVar5;
  char (*Args_3) [8];
  string msg;
  Uint64 DstOffset_local;
  Uint64 SrcOffset_local;
  String local_50;
  
  CVar2 = (this->m_Desc).QueueType;
  UVar5 = SrcOffset;
  Args_3 = (char (*) [8])DstOffset;
  DstOffset_local = DstOffset;
  SrcOffset_local = SrcOffset;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CopyBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6d1);
      std::__cxx11::string::~string((string *)&msg);
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d1);
    std::__cxx11::string::~string((string *)&msg);
    CVar2 = (this->m_Desc).QueueType;
    UVar5 = extraout_RDX;
  }
  if ((CVar2 & COMMAND_QUEUE_TYPE_TRANSFER) == COMMAND_QUEUE_TYPE_UNKNOWN) {
    GetCommandQueueTypeString_abi_cxx11_
              (&local_50,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)UVar5);
    FormatString<char[11],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)0x5d53d5,(char (*) [11])0x65e20a,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    std::__cxx11::string::~string((string *)&local_50);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d1);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (pSrcBuffer == (IBuffer *)0x0) {
    FormatString<char[31]>(&msg,(char (*) [31])"Source buffer must not be null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d2);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (pDstBuffer == (IBuffer *)0x0) {
    FormatString<char[36]>(&msg,(char (*) [36])"Destination buffer must not be null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d3);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[56]>
              (&msg,(char (*) [56])"CopyBuffer command must be used outside of render pass.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d4);
    std::__cxx11::string::~string((string *)&msg);
  }
  pBVar3 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pSrcBuffer);
  Args = &(pBVar3->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc;
  pBVar4 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pDstBuffer);
  Args_2 = &(pBVar4->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc;
  local_50._M_dataplus._M_p = (pointer)(DstOffset + Size);
  if ((pointer)(pBVar4->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.Size < local_50._M_dataplus._M_p) {
    FormatString<char[24],char_const*,char[7],char_const*,char[23],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
              (&msg,(Diligent *)"Failed to copy buffer \'",(char (*) [24])Args,(char **)"\' to \'",
               (char (*) [7])Args_2,(char **)"\': Destination range [",
               (char (*) [23])&DstOffset_local,(unsigned_long *)0x6067ff,(char (*) [2])&local_50,
               (unsigned_long *)") is out of buffer bounds [0,",
               (char (*) [30])
               &(pBVar4->super_BufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                .m_Desc.Size,(unsigned_long *)0x647201,(char (*) [2])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6d9);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_50._M_dataplus._M_p = (pointer)(SrcOffset + Size);
  if ((pointer)(pBVar3->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.Size < local_50._M_dataplus._M_p) {
    FormatString<char[24],char_const*,char[7],char_const*,char[18],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
              (&msg,(Diligent *)"Failed to copy buffer \'",(char (*) [24])Args,(char **)"\' to \'",
               (char (*) [7])Args_2,(char **)"\': Source range [",(char (*) [18])&SrcOffset_local,
               (unsigned_long *)0x6067ff,(char (*) [2])&local_50,
               (unsigned_long *)") is out of buffer bounds [0,",
               (char (*) [30])
               &(pBVar3->super_BufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                .m_Desc.Size,(unsigned_long *)0x647201,(char (*) [2])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6da);
    std::__cxx11::string::~string((string *)&msg);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.CopyBuffer;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::CopyBuffer(
    IBuffer*                       pSrcBuffer,
    Uint64                         SrcOffset,
    RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
    IBuffer*                       pDstBuffer,
    Uint64                         DstOffset,
    Uint64                         Size,
    RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "CopyBuffer");
    DEV_CHECK_ERR(pSrcBuffer != nullptr, "Source buffer must not be null");
    DEV_CHECK_ERR(pDstBuffer != nullptr, "Destination buffer must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "CopyBuffer command must be used outside of render pass.");
#ifdef DILIGENT_DEVELOPMENT
    {
        const BufferDesc& SrcBufferDesc = ClassPtrCast<BufferImplType>(pSrcBuffer)->GetDesc();
        const BufferDesc& DstBufferDesc = ClassPtrCast<BufferImplType>(pDstBuffer)->GetDesc();
        DEV_CHECK_ERR(DstOffset + Size <= DstBufferDesc.Size, "Failed to copy buffer '", SrcBufferDesc.Name, "' to '", DstBufferDesc.Name, "': Destination range [", DstOffset, ",", DstOffset + Size, ") is out of buffer bounds [0,", DstBufferDesc.Size, ")");
        DEV_CHECK_ERR(SrcOffset + Size <= SrcBufferDesc.Size, "Failed to copy buffer '", SrcBufferDesc.Name, "' to '", DstBufferDesc.Name, "': Source range [", SrcOffset, ",", SrcOffset + Size, ") is out of buffer bounds [0,", SrcBufferDesc.Size, ")");
    }
#endif

    ++m_Stats.CommandCounters.CopyBuffer;
}